

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> __thiscall
wabt::MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location&>
          (wabt *this,Var *args,Location *args_1)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  Var local_70;
  
  puVar4 = (undefined8 *)operator_new(0x88);
  Var::Var(&local_70,args);
  puVar4[1] = 0;
  puVar4[2] = 0;
  *puVar4 = &PTR__ModuleField_0020d4a0;
  sVar1 = (args_1->filename).size_;
  sVar2 = (args_1->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args_1->field_1 + 8);
  puVar4[3] = (args_1->filename).data_;
  puVar4[4] = sVar1;
  puVar4[5] = sVar2;
  puVar4[6] = uVar3;
  *(undefined4 *)(puVar4 + 7) = 9;
  *puVar4 = &PTR__StartModuleField_0020df98;
  Var::Var((Var *)(puVar4 + 8),&local_70);
  *(undefined8 **)this = puVar4;
  Var::~Var(&local_70);
  return (__uniq_ptr_data<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}